

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::InitializeIntlForDatePrototype(JavascriptLibrary *this)

{
  ScriptContext *this_00;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  IntlEngineInterfaceExtensionObject *this_01;
  
  this_00 = (((((((this->super_JavascriptLibraryBase).IntlObject.ptr)->super_RecyclableObject).type.
               ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  BVar4 = ScriptContext::VerifyAlive(this_00,0,(ScriptContext *)0x0);
  if (BVar4 == 0) {
    return;
  }
  pJVar1 = (((((this->super_JavascriptLibraryBase).IntlObject.ptr)->super_RecyclableObject).type.ptr
            )->javascriptLibrary).ptr;
  if ((pJVar1->super_JavascriptLibraryBase).engineInterfaceObject.ptr ==
      (EngineInterfaceObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x14eb,"(library->engineInterfaceObject != nullptr)",
                                "library->engineInterfaceObject != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_01 = (IntlEngineInterfaceExtensionObject *)
            EngineInterfaceObject::GetEngineExtension
                      ((pJVar1->super_JavascriptLibraryBase).engineInterfaceObject.ptr,
                       EngineInterfaceExtensionKind_Intl);
  IntlEngineInterfaceExtensionObject::InjectIntlLibraryCode
            (this_01,this_00,(this->super_JavascriptLibraryBase).IntlObject.ptr,DatePrototype);
  return;
}

Assistant:

void JavascriptLibrary::InitializeIntlForDatePrototype()
    {
        auto datePrototypeInitializer = [&](IntlEngineInterfaceExtensionObject* intlExtension, ScriptContext * scriptContext, DynamicObject* intlObject) ->void
        {
            intlExtension->InjectIntlLibraryCode(scriptContext, intlObject, IntlInitializationType::DatePrototype);
        };
        InitializeIntlForPrototypes(datePrototypeInitializer);
    }